

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzprinteg.h
# Opt level: O3

void __thiscall
TPZPrInteg<TPZIntPrism3D>::SetOrder(TPZPrInteg<TPZIntPrism3D> *this,TPZVec<int> *ord,int type)

{
  int order;
  TPZGaussRule *pTVar1;
  
  if (ord->fNElements < 4) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "TPZPrInteg::SetOrder: number of integration points specified smaller than dimension\n"
               ,0x54);
    return;
  }
  TPZIntPrism3D::SetOrder(&this->super_TPZIntPrism3D,ord,type);
  order = ord->fStore[3];
  this->fOrdKsi = order;
  pTVar1 = TPZIntRuleList::GetRule(&TPZIntRuleList::gIntRuleList,order,0);
  this->fIntP = pTVar1;
  return;
}

Assistant:

void SetOrder(TPZVec<int> &ord, int type = 0) override
    {
#ifndef PZNODEBUG
		if(ord.NElements() < Dim) {
			std::cout << "TPZPrInteg::SetOrder: number of integration points specified smaller than dimension\n";
			return;
		}
#endif
		TFather::SetOrder(ord,type);
		fOrdKsi = ord[Dim-1];
		fIntP   = TPZIntRuleList::gIntRuleList.GetRule(ord[Dim-1]);
    }